

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O1

void cfd::js::api::AddPsbtOutput(Psbt *psbt,PsbtAddOutputRequestStruct *request)

{
  pointer pPVar1;
  uint uVar2;
  pointer pPVar3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  AddressFactory_conflict factory;
  Script redeem_script;
  Address addr;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_238;
  AddressFactory local_218;
  Amount local_1f0 [16];
  Script local_1e0;
  undefined1 local_1a8 [72];
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  uVar2 = cfd::core::Psbt::GetTxOutCount();
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_1e0);
  ParsePsbtOutputRequest(&request->output,&local_238,&local_1e0);
  if ((request->txout).address._M_string_length == 0) {
    cfd::core::Script::Script((Script *)local_1a8,(string *)&(request->txout).direct_locking_script)
    ;
    cfd::core::Amount::Amount((Amount *)&local_218,(request->txout).amount);
    cfd::core::Psbt::AddTxOut((Script *)psbt,(Amount *)local_1a8);
    core::Script::~Script((Script *)local_1a8);
    cfd::core::Psbt::SetTxOutData((uint)psbt,(Script *)(ulong)uVar2,(vector *)&local_1e0);
  }
  else {
    cfd::AddressFactory::AddressFactory(&local_218);
    cfd::AddressFactory::GetAddress((string *)local_1a8);
    cfd::core::Amount::Amount(local_1f0,(request->txout).amount);
    cfd::Psbt::AddTxOutData
              ((Amount *)psbt,(Address *)local_1f0,(Script *)local_1a8,(vector *)&local_1e0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    core::Script::~Script(&local_a0);
    local_130[0] = cfd::core::Privkey::Privkey;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8)
    ;
    core::TapBranch::~TapBranch((TapBranch *)local_130);
    if (local_148 != (void *)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (void *)0x0) {
      operator_delete(local_160);
    }
    if ((void *)local_1a8._48_8_ != (void *)0x0) {
      operator_delete((void *)local_1a8._48_8_);
    }
    if ((undefined1 *)local_1a8._16_8_ != local_1a8 + 0x20) {
      operator_delete((void *)local_1a8._16_8_);
    }
    local_218._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00a93380;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_218.prefix_list_);
  }
  pPVar3 = (request->output).unknown.
           super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (request->output).unknown.
           super__Vector_base<cfd::js::api::PsbtMapDataStruct,_std::allocator<cfd::js::api::PsbtMapDataStruct>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar3 != pPVar1) {
    do {
      cfd::core::ByteData::ByteData((ByteData *)local_1a8,(string *)pPVar3);
      cfd::core::ByteData::ByteData((ByteData *)&local_218,(string *)&pPVar3->value);
      cfd::core::Psbt::SetTxOutRecord((uint)psbt,(ByteData *)(ulong)uVar2,(ByteData *)local_1a8);
      if (local_218._vptr_AddressFactory != (_func_int **)0x0) {
        operator_delete(local_218._vptr_AddressFactory);
      }
      if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_1a8._0_8_);
      }
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
  }
  core::Script::~Script(&local_1e0);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_238);
  return;
}

Assistant:

void AddPsbtOutput(Psbt* psbt, const PsbtAddOutputRequestStruct& request) {
  uint32_t index = psbt->GetTxOutCount();

  std::vector<KeyData> key_list;
  Script redeem_script;
  ParsePsbtOutputRequest(request.output, &key_list, &redeem_script);

  if (!request.txout.address.empty()) {
    AddressFactory factory;
    auto addr = factory.GetAddress(request.txout.address);
    psbt->AddTxOutData(
        Amount(request.txout.amount), addr, redeem_script, key_list);
  } else {
    psbt->AddTxOut(
        Script(request.txout.direct_locking_script),
        Amount(request.txout.amount));
    psbt->SetTxOutData(index, redeem_script, key_list);
  }

  for (const auto& data : request.output.unknown) {
    psbt->SetTxOutRecord(index, ByteData(data.key), ByteData(data.value));
  }
}